

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  ushort uVar1;
  long lVar2;
  void *pvVar3;
  Pager *pPVar4;
  LookasideSlot *pLVar5;
  LookasideSlot *pLVar6;
  Schema *pSVar7;
  _ht *p_Var8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Btree **ppBVar13;
  LookasideSlot *pLVar14;
  long lVar15;
  Vdbe *p;
  int iVar16;
  HashElem *pHVar17;
  long lVar18;
  long in_FS_OFFSET;
  int nByte;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  switch(op) {
  case 0:
    iVar16 = sqlite3LookasideUsed(db,pHighwater);
    *pCurrent = iVar16;
    iVar16 = 0;
    if (resetFlag != 0) {
      pLVar5 = (db->lookaside).pFree;
      pLVar6 = pLVar5;
      if (pLVar5 != (LookasideSlot *)0x0) {
        do {
          pLVar14 = pLVar6;
          pLVar6 = pLVar14->pNext;
        } while (pLVar6 != (LookasideSlot *)0x0);
        pLVar14->pNext = (db->lookaside).pInit;
        (db->lookaside).pInit = pLVar5;
        (db->lookaside).pFree = (LookasideSlot *)0x0;
      }
      pLVar5 = (db->lookaside).pSmallFree;
      pLVar6 = pLVar5;
      if (pLVar5 != (LookasideSlot *)0x0) {
        do {
          pLVar14 = pLVar6;
          pLVar6 = pLVar14->pNext;
        } while (pLVar6 != (LookasideSlot *)0x0);
        pLVar14->pNext = (db->lookaside).pSmallInit;
        (db->lookaside).pSmallInit = pLVar5;
        (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
      }
    }
    break;
  case 1:
  case 0xb:
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    if (db->nDb < 1) {
      iVar16 = 0;
    }
    else {
      lVar18 = 0;
      lVar15 = 8;
      iVar16 = 0;
      do {
        lVar2 = *(long *)((long)&db->aDb->zDbSName + lVar15);
        if (lVar2 != 0) {
          pvVar3 = (void *)**(undefined8 **)(lVar2 + 8);
          iVar11 = *(int *)((long)pvVar3 + 200);
          uVar1 = *(ushort *)((long)pvVar3 + 0xb0);
          iVar9 = (*sqlite3Config.pcache2.xPagecount)
                            (*(sqlite3_pcache **)(*(long *)((long)pvVar3 + 0x120) + 0x48));
          iVar10 = (*sqlite3Config.m.xSize)(pvVar3);
          iVar11 = iVar10 + iVar9 * (iVar11 + (uint)uVar1 + 0x78) + *(int *)((long)pvVar3 + 200);
          if (op == 0xb) {
            iVar11 = iVar11 / *(int *)(*(long *)(lVar2 + 8) + 0x68);
          }
          iVar16 = iVar16 + iVar11;
        }
        lVar18 = lVar18 + 1;
        lVar15 = lVar15 + 0x20;
      } while (lVar18 < db->nDb);
    }
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    *pCurrent = iVar16;
    *pHighwater = 0;
    goto LAB_0011c8f8;
  case 2:
    local_3c = 0;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    db->pnBytesFreed = (int *)&local_3c;
    (db->lookaside).pEnd = (db->lookaside).pStart;
    if (0 < db->nDb) {
      lVar15 = 0;
      do {
        pSVar7 = db->aDb[lVar15].pSchema;
        if (pSVar7 != (Schema *)0x0) {
          iVar16 = (*sqlite3Config.m.xRoundup)(0x20);
          local_3c = local_3c +
                     ((pSVar7->trigHash).count + (pSVar7->tblHash).count + (pSVar7->idxHash).count +
                     (pSVar7->fkeyHash).count) * iVar16;
          p_Var8 = (pSVar7->tblHash).ht;
          iVar11 = 0;
          iVar16 = 0;
          if (p_Var8 != (_ht *)0x0) {
            iVar16 = (*sqlite3Config.m.xSize)(p_Var8);
          }
          local_3c = local_3c + iVar16;
          p_Var8 = (pSVar7->trigHash).ht;
          if (p_Var8 != (_ht *)0x0) {
            iVar11 = (*sqlite3Config.m.xSize)(p_Var8);
          }
          local_3c = local_3c + iVar11;
          p_Var8 = (pSVar7->idxHash).ht;
          iVar11 = 0;
          iVar16 = 0;
          if (p_Var8 != (_ht *)0x0) {
            iVar16 = (*sqlite3Config.m.xSize)(p_Var8);
          }
          local_3c = local_3c + iVar16;
          p_Var8 = (pSVar7->fkeyHash).ht;
          if (p_Var8 != (_ht *)0x0) {
            iVar11 = (*sqlite3Config.m.xSize)(p_Var8);
          }
          local_3c = local_3c + iVar11;
          for (pHVar17 = (pSVar7->trigHash).first; pHVar17 != (HashElem *)0x0;
              pHVar17 = pHVar17->next) {
            sqlite3DeleteTrigger(db,(Trigger *)pHVar17->data);
          }
          for (pHVar17 = (pSVar7->tblHash).first; pHVar17 != (HashElem *)0x0;
              pHVar17 = pHVar17->next) {
            sqlite3DeleteTable(db,(Table *)pHVar17->data);
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < db->nDb);
    }
    db->pnBytesFreed = (int *)0x0;
    (db->lookaside).pEnd = (db->lookaside).pTrueEnd;
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    *pHighwater = 0;
    uVar12 = local_3c;
    goto LAB_0011c8c8;
  case 3:
    local_3c = 0;
    db->pnBytesFreed = (int *)&local_3c;
    p = db->pVdbe;
    (db->lookaside).pEnd = (db->lookaside).pStart;
    for (; p != (Vdbe *)0x0; p = p->pVNext) {
      sqlite3VdbeDelete(p);
    }
    (db->lookaside).pEnd = (db->lookaside).pTrueEnd;
    db->pnBytesFreed = (int *)0x0;
    *pHighwater = 0;
    uVar12 = local_3c;
    goto LAB_0011c8c8;
  case 4:
  case 5:
  case 6:
    *pCurrent = 0;
    *pHighwater = (db->lookaside).anStat[(long)op + -4];
    iVar16 = 0;
    if (resetFlag != 0) {
      (db->lookaside).anStat[(long)op + -4] = 0;
    }
    break;
  case 10:
    *pHighwater = 0;
    uVar12 = 1;
    if (db->nDeferredImmCons < 1) {
      uVar12 = (uint)(0 < db->nDeferredCons);
    }
LAB_0011c8c8:
    *pCurrent = uVar12;
LAB_0011c8f8:
    iVar16 = 0;
    break;
  case 0xc:
    op = 10;
  case 7:
  case 8:
  case 9:
    iVar16 = 0;
    uVar12 = 0;
    if (0 < db->nDb) {
      ppBVar13 = &db->aDb->pBt;
      lVar15 = 0;
      uVar12 = 0;
      do {
        if (*ppBVar13 != (Btree *)0x0) {
          pPVar4 = (*ppBVar13)->pBt->pPager;
          uVar12 = uVar12 + pPVar4->aStat[op + -7];
          if (resetFlag != 0) {
            pPVar4->aStat[op + -7] = 0;
          }
        }
        lVar15 = lVar15 + 1;
        ppBVar13 = ppBVar13 + 4;
      } while (lVar15 < db->nDb);
      uVar12 = uVar12 & 0x7fffffff;
    }
    *pHighwater = 0;
    *pCurrent = uVar12;
    break;
  default:
    iVar16 = 1;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar16;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pCurrent==0|| pHighwater==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = sqlite3LookasideUsed(db, pHighwater);
      if( resetFlag ){
        LookasideSlot *p = db->lookaside.pFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pInit;
          db->lookaside.pInit = db->lookaside.pFree;
          db->lookaside.pFree = 0;
        }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
        p = db->lookaside.pSmallFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pSmallInit;
          db->lookaside.pSmallInit = db->lookaside.pSmallFree;
          db->lookaside.pSmallFree = 0;
        }
#endif
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /*
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED_SHARED:
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          int nByte = sqlite3PagerMemUsed(pPager);
          if( op==SQLITE_DBSTATUS_CACHE_USED_SHARED ){
            nByte = nByte / sqlite3BtreeConnectionCount(pBt);
          }
          totalUsed += nByte;
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3_msize(pSchema->tblHash.ht);
          nByte += sqlite3_msize(pSchema->trigHash.ht);
          nByte += sqlite3_msize(pSchema->idxHash.ht);
          nByte += sqlite3_msize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pVNext){
        sqlite3VdbeDelete(pVdbe);
      }
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      db->pnBytesFreed = 0;

      *pHighwater = 0;  /* IMP: R-64479-57858 */
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_SPILL:
      op = SQLITE_DBSTATUS_CACHE_WRITE+1;
      /* no break */ deliberate_fall_through
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      u64 nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0; /* IMP: R-42420-56072 */
                       /* IMP: R-54100-20147 */
                       /* IMP: R-29431-39229 */
      *pCurrent = (int)nRet & 0x7fffffff;
      break;
    }

    /* Set *pCurrent to non-zero if there are unresolved deferred foreign
    ** key constraints.  Set *pCurrent to zero if all foreign key constraints
    ** have been satisfied.  The *pHighwater is always set to zero.
    */
    case SQLITE_DBSTATUS_DEFERRED_FKS: {
      *pHighwater = 0;  /* IMP: R-11967-56545 */
      *pCurrent = db->nDeferredImmCons>0 || db->nDeferredCons>0;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}